

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O3

void __thiscall BoolLinearLE<0>::wakeup(BoolLinearLE<0> *this,int i,int param_2)

{
  int iVar1;
  TrailElem local_20;
  
  if (i < (int)(this->x).sz) {
    local_20.pt = &(this->ones).v;
    local_20.x = (this->ones).v;
    iVar1 = local_20.x + 1;
    local_20.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_20);
    (this->ones).v = iVar1;
  }
  if ((this->super_Propagator).in_queue == false) {
    (this->super_Propagator).in_queue = true;
    local_20.pt = (int *)this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_Propagator).priority,
               (Propagator **)&local_20);
  }
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < static_cast<int>(x.size())) {
			ones++;
		}
		pushInQueue();
	}